

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall Lowerer::LowerLdArrViewElemWasm(Lowerer *this,Instr *instr)

{
  Instr *pIVar1;
  Opnd *dst;
  Opnd *addrOpnd;
  Opnd *src2;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  JITTimeFunctionBody *pJVar5;
  undefined4 *puVar6;
  Instr *pIVar7;
  Lowerer *in_stack_ffffffffffffffb0;
  
  pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar3 = JITTimeFunctionBody::IsWasmFunction(pJVar5);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2579,"(m_func->GetJITFunctionBody()->IsWasmFunction())",
                       "m_func->GetJITFunctionBody()->IsWasmFunction()");
    if (!bVar3) goto LAB_005b3ba6;
    *puVar6 = 0;
  }
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x257a,"(instr)","instr");
    if (!bVar3) goto LAB_005b3ba6;
    *puVar6 = 0;
  }
  if (instr->m_opcode != LdArrViewElemWasm) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x257b,"(instr->m_opcode == Js::OpCode::LdArrViewElemWasm)",
                       "instr->m_opcode == Js::OpCode::LdArrViewElemWasm");
    if (!bVar3) goto LAB_005b3ba6;
    *puVar6 = 0;
  }
  pIVar1 = instr->m_prev;
  dst = instr->m_dst;
  addrOpnd = instr->m_src1;
  if ((dst->m_type == TyFloat32) && (addrOpnd->m_type != TyFloat32)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2582,"(!dst->IsFloat32() || src1->IsFloat32())",
                       "!dst->IsFloat32() || src1->IsFloat32()");
    if (!bVar3) goto LAB_005b3ba6;
    *puVar6 = 0;
  }
  if ((dst->m_type == TyFloat64) && (addrOpnd->m_type != TyFloat64)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2583,"(!dst->IsFloat64() || src1->IsFloat64())",
                       "!dst->IsFloat64() || src1->IsFloat64()");
    if (!bVar3) goto LAB_005b3ba6;
    *puVar6 = 0;
  }
  pIVar7 = LowerWasmArrayBoundsCheck(this,instr,addrOpnd);
  src2 = instr->m_src2;
  OVar4 = IR::Opnd::GetKind(addrOpnd);
  if (OVar4 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar3) {
LAB_005b3ba6:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  pIVar7 = InsertMaskableMove(false,true,dst,addrOpnd,src2,*(Opnd **)&addrOpnd[1].m_valueType,pIVar7
                              ,in_stack_ffffffffffffffb0);
  pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar3 = JITTimeFunctionBody::UsesWAsmJsFastVirtualBuffer(pJVar5);
  if (bVar3) {
    pIVar7->field_0x38 = pIVar7->field_0x38 | 2;
  }
  IR::Instr::Remove(instr);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerLdArrViewElemWasm(IR::Instr * instr)
{
#ifdef ENABLE_WASM
    Assert(m_func->GetJITFunctionBody()->IsWasmFunction());
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::LdArrViewElemWasm);

    IR::Instr * instrPrev = instr->m_prev;

    IR::Opnd * dst = instr->GetDst();
    IR::Opnd * src1 = instr->GetSrc1();

    Assert(!dst->IsFloat32() || src1->IsFloat32());
    Assert(!dst->IsFloat64() || src1->IsFloat64());

    IR::Instr * done = LowerWasmArrayBoundsCheck(instr, src1);

    IR::Instr* newMove = InsertMaskableMove(false, true, dst, src1, instr->GetSrc2(), src1->AsIndirOpnd()->GetIndexOpnd(), done, this);

    if (m_func->GetJITFunctionBody()->UsesWAsmJsFastVirtualBuffer())
    {
        // We need to have an AV when accessing out of bounds memory even if the dst is not used
        // Make sure LinearScan doesn't dead store this instruction
        newMove->hasSideEffects = true;
    }

    instr->Remove();
    return instrPrev;
#else
    Assert(UNREACHED);
    return instr;
#endif
}